

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_base.c
# Opt level: O0

int lj_cf_load(lua_State *L)

{
  int iVar1;
  GCstr *pGVar2;
  GCstr *pGVar3;
  long in_RDI;
  char *in_stack_00000030;
  char *in_stack_00000038;
  void *in_stack_00000040;
  lua_Reader in_stack_00000048;
  GCstr *s;
  int status;
  GCstr *mode;
  GCstr *name;
  undefined8 in_stack_ffffffffffffff88;
  char *in_stack_ffffffffffffff90;
  lua_State *in_stack_ffffffffffffff98;
  lua_State *in_stack_ffffffffffffffa0;
  GCstr *local_48;
  
  iVar1 = (int)((ulong)in_stack_ffffffffffffff88 >> 0x20);
  pGVar2 = lj_lib_optstr(in_stack_ffffffffffffffa0,(int)((ulong)in_stack_ffffffffffffff98 >> 0x20));
  pGVar3 = lj_lib_optstr(in_stack_ffffffffffffffa0,(int)((ulong)in_stack_ffffffffffffff98 >> 0x20));
  if ((*(ulong *)(in_RDI + 0x10) < *(ulong *)(in_RDI + 0x18)) &&
     ((*(int *)(*(long *)(in_RDI + 0x10) + 4) == -5 ||
      (*(uint *)(*(long *)(in_RDI + 0x10) + 4) < 0xffff0000)))) {
    local_48 = lj_lib_checkstr(in_stack_ffffffffffffffa0,
                               (int)((ulong)in_stack_ffffffffffffff98 >> 0x20));
    lua_settop((lua_State *)in_stack_ffffffffffffff90,iVar1);
    if (pGVar2 != (GCstr *)0x0) {
      local_48 = pGVar2;
    }
    if (pGVar3 == (GCstr *)0x0) {
      pGVar3 = (GCstr *)0x0;
    }
    else {
      pGVar3 = pGVar3 + 1;
    }
    luaL_loadbufferx((lua_State *)(local_48 + 1),(char *)pGVar3,(size_t)in_stack_ffffffffffffffa0,
                     (char *)in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  }
  else {
    lj_lib_checkfunc((lua_State *)in_stack_ffffffffffffff90,iVar1);
    lua_settop((lua_State *)in_stack_ffffffffffffff90,iVar1);
    if (pGVar2 == (GCstr *)0x0) {
      in_stack_ffffffffffffff90 = "=(load)";
    }
    else {
      in_stack_ffffffffffffff90 = (char *)(pGVar2 + 1);
    }
    in_stack_ffffffffffffff98 = (lua_State *)in_stack_ffffffffffffff90;
    lua_loadx((lua_State *)s,in_stack_00000048,in_stack_00000040,in_stack_00000038,in_stack_00000030
             );
  }
  iVar1 = load_aux(in_stack_ffffffffffffff98,(int)((ulong)in_stack_ffffffffffffff90 >> 0x20),
                   (int)in_stack_ffffffffffffff90);
  return iVar1;
}

Assistant:

LJLIB_CF(load)
{
  GCstr *name = lj_lib_optstr(L, 2);
  GCstr *mode = lj_lib_optstr(L, 3);
  int status;
  if (L->base < L->top && (tvisstr(L->base) || tvisnumber(L->base))) {
    GCstr *s = lj_lib_checkstr(L, 1);
    lua_settop(L, 4);  /* Ensure env arg exists. */
    status = luaL_loadbufferx(L, strdata(s), s->len, strdata(name ? name : s),
			      mode ? strdata(mode) : NULL);
  } else {
    lj_lib_checkfunc(L, 1);
    lua_settop(L, 5);  /* Reserve a slot for the string from the reader. */
    status = lua_loadx(L, reader_func, NULL, name ? strdata(name) : "=(load)",
		       mode ? strdata(mode) : NULL);
  }
  return load_aux(L, status, 4);
}